

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O2

void __thiscall SerialExecutionQueue::cancelAllJobs(SerialExecutionQueue *this)

{
  mutex *__mutex;
  pointer __p;
  SerialExecutionQueue *local_38;
  pointer local_30;
  code *local_28;
  undefined8 local_20;
  
  __mutex = &(this->spawnedProcesses).mutex;
  std::mutex::lock(__mutex);
  if (((this->cancelled)._M_base._M_i & 1U) != 0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  LOCK();
  (this->cancelled)._M_base._M_i = true;
  UNLOCK();
  (this->spawnedProcesses).closed = true;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  llbuild::basic::ProcessGroup::signalAll(&this->spawnedProcesses,2);
  std::mutex::lock(&this->killAfterTimeoutThreadMutex);
  local_28 = killAfterTimeout;
  local_20 = 0;
  local_38 = this;
  llvm::make_unique<std::thread,void(SerialExecutionQueue::*)(),SerialExecutionQueue*>
            ((llvm *)&local_30,(type *)&local_28,&local_38);
  __p = local_30;
  local_30 = (pointer)0x0;
  std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
            ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)
             &this->killAfterTimeoutThread,__p);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
            ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)&local_30);
  pthread_mutex_unlock((pthread_mutex_t *)&this->killAfterTimeoutThreadMutex);
  return;
}

Assistant:

virtual void cancelAllJobs() override {
    {
      std::lock_guard<std::mutex> guard(spawnedProcesses.mutex);
      if (cancelled) return;
      cancelled = true;
      spawnedProcesses.close();
    }

    spawnedProcesses.signalAll(SIGINT);
    {
      std::lock_guard<std::mutex> guard(killAfterTimeoutThreadMutex);
      killAfterTimeoutThread = llvm::make_unique<std::thread>(
          &SerialExecutionQueue::killAfterTimeout, this);
    }
  }